

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O3

int Kf_ManComputeRefs(Kf_Man_t *p)

{
  int *piVar1;
  float fVar2;
  int *piVar3;
  float *pfVar4;
  float *pfVar5;
  Jf_Par_t *pJVar6;
  Gia_Man_t *pGVar7;
  Gia_Obj_t *pGVar8;
  word *pwVar9;
  bool bVar10;
  float fVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  Gia_Obj_t *pGVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  float fVar24;
  word local_40;
  word local_38;
  
  piVar3 = p->pGia->pRefs;
  if (piVar3 == (int *)0x0) {
    __assert_fail("p->pGia->pRefs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                  ,0x390,"int Kf_ManComputeRefs(Kf_Man_t *)");
  }
  pfVar4 = (p->vRefs).pArray;
  pfVar5 = (p->vArea).pArray;
  memset(piVar3,0,(long)p->pGia->nObjs << 2);
  pJVar6 = p->pPars;
  pJVar6->Area = 0;
  pJVar6->Edge = 0;
  pGVar7 = p->pGia;
  if (0 < (long)pGVar7->nObjs) {
    local_38 = 0;
    local_40 = 0;
    lVar21 = (long)pGVar7->nObjs;
    do {
      uVar13 = pGVar7->nObjs;
      if ((int)uVar13 < lVar21) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar8 = pGVar7->pObjs;
      if (pGVar8 == (Gia_Obj_t *)0x0) goto LAB_007608b9;
      lVar22 = lVar21 + -1;
      uVar19 = *(ulong *)(pGVar8 + lVar22);
      uVar17 = (uint)uVar19;
      uVar14 = uVar19 & 0x1fffffff;
      if (((int)uVar17 < 0 && uVar14 != 0x1fffffff) ||
         (((-1 < (int)uVar17 && ((uVar17 & 0x1fffffff) != 0x1fffffff)) &&
          ((uVar17 & 0x1fffffff) == ((uint)(uVar19 >> 0x20) & 0x1fffffff))))) {
        pGVar18 = pGVar8 + lVar22 + -uVar14;
        if ((pGVar18 < pGVar8) || (pGVar8 + (int)uVar13 <= pGVar18)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        pGVar7->pRefs[(int)((ulong)((long)pGVar18 - (long)pGVar8) >> 2) * -0x55555555] =
             pGVar7->pRefs[(int)((ulong)((long)pGVar18 - (long)pGVar8) >> 2) * -0x55555555] + 1;
      }
      else if (((int)uVar14 != 0x1fffffff && -1 < (int)uVar17) &&
              (piVar3 = pGVar7->pRefs, 0 < piVar3[lVar22])) {
        if ((p->vCuts).nSize < lVar21) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar13 = (p->vCuts).pArray[lVar22];
        pwVar9 = (p->pMem).pPages[(int)uVar13 >> ((byte)(p->pMem).nPageSize & 0x1f)];
        lVar15 = (long)(int)(uVar13 & (p->pMem).uPageMask);
        lVar23 = (long)*(int *)((long)pwVar9 + lVar15 * 8 + 4);
        lVar20 = (long)*(int *)((long)pwVar9 + lVar23 * 4 + lVar15 * 8);
        if (0 < lVar20) {
          lVar16 = 0;
          do {
            uVar13 = *(uint *)((long)pwVar9 + lVar16 * 4 + lVar23 * 4 + lVar15 * 8 + 4);
            if ((int)uVar13 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            piVar1 = piVar3 + (uVar13 >> 1);
            *piVar1 = *piVar1 + 1;
            lVar20 = (long)*(int *)((long)pwVar9 + lVar23 * 4 + lVar15 * 8);
            lVar16 = lVar16 + 1;
          } while (lVar16 < lVar20);
        }
        local_40 = local_40 + lVar20;
        pJVar6->Edge = local_40;
        local_38 = local_38 + 1;
        pJVar6->Area = local_38;
      }
      bVar10 = 1 < lVar21;
      lVar21 = lVar22;
    } while (bVar10);
    uVar13 = pGVar7->nObjs;
LAB_007608b9:
    if (0 < (int)uVar13) {
      iVar12 = pJVar6->fOptEdge;
      piVar3 = pGVar7->pRefs;
      uVar19 = 0;
      do {
        fVar2 = pfVar4[uVar19];
        if (iVar12 == 0) {
          fVar11 = (float)piVar3[uVar19] * 0.8;
          fVar24 = 0.2;
        }
        else {
          fVar11 = (float)piVar3[uVar19] * 0.2;
          fVar24 = 0.8;
        }
        fVar11 = fVar2 * fVar24 + fVar11;
        fVar24 = 1.0;
        if (1.0 <= fVar11) {
          fVar24 = fVar11;
        }
        pfVar5[uVar19] = (fVar2 * pfVar5[uVar19]) / fVar24;
        pfVar4[uVar19] = fVar24;
        if (pfVar5[uVar19] < 0.0) {
          __assert_fail("pFlow[i] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                        ,0x3a8,"int Kf_ManComputeRefs(Kf_Man_t *)");
        }
        uVar19 = uVar19 + 1;
      } while (uVar13 != uVar19);
    }
  }
  iVar12 = Kf_ManComputeDelay(p,1);
  pJVar6 = p->pPars;
  pJVar6->Delay = (long)iVar12;
  return (int)pJVar6->Area;
}

Assistant:

int Kf_ManComputeRefs( Kf_Man_t * p )
{
    Gia_Obj_t * pObj; 
    float nRefsNew; int i, * pCut;
    float * pRefs = Vec_FltArray(&p->vRefs);
    float * pFlow = Vec_FltArray(&p->vArea);
    assert( p->pGia->pRefs != NULL );
    memset( p->pGia->pRefs, 0, sizeof(int) * Gia_ManObjNum(p->pGia) );
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachObjReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCo(pObj) || Gia_ObjIsBuf(pObj) )
            Gia_ObjRefInc( p->pGia, Gia_ObjFanin0(pObj) );
        else if ( Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p->pGia, pObj) > 0 )
        {
            pCut = Kf_ObjCutBest(p, i);
            Kf_CutRef( p, pCut );
            p->pPars->Edge += Kf_CutSize(pCut);
            p->pPars->Area++;
        }
    }
    // blend references and normalize flow
    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
    {
        if ( p->pPars->fOptEdge )
            nRefsNew = Abc_MaxFloat( 1, 0.8 * pRefs[i] + 0.2 * p->pGia->pRefs[i] );
        else
            nRefsNew = Abc_MaxFloat( 1, 0.2 * pRefs[i] + 0.8 * p->pGia->pRefs[i] );
        pFlow[i] = pFlow[i] * pRefs[i] / nRefsNew;
        pRefs[i] = nRefsNew;
        assert( pFlow[i] >= 0 );
    }
    // compute delay
    p->pPars->Delay = Kf_ManComputeDelay( p, 1 );
    return p->pPars->Area;
}